

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SourceLineInfo * __thiscall
Catch::AssertionResult::getSourceInfo(SourceLineInfo *__return_storage_ptr__,AssertionResult *this)

{
  AssertionResult *this_local;
  
  SourceLineInfo::SourceLineInfo(__return_storage_ptr__,&(this->m_info).lineInfo);
  return __return_storage_ptr__;
}

Assistant:

SourceLineInfo AssertionResult::getSourceInfo() const {
        return m_info.lineInfo;
    }